

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

BinsSelectConditionExprSyntax * __thiscall
slang::parsing::Parser::parseBinsSelectPrimary::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this)

{
  Parser *this_00;
  bool bVar1;
  NameSyntax *name;
  RangeListSyntax *ranges;
  IntersectClauseSyntax *intersects;
  BinsSelectConditionExprSyntax *pBVar2;
  Token binsof;
  Token openParen;
  Token closeParen;
  Token intersect;
  
  this_00 = this->this;
  binsof = ParserBase::expect(&this_00->super_ParserBase,BinsOfKeyword);
  openParen = ParserBase::expect(&this_00->super_ParserBase,OpenParenthesis);
  name = parseName(this_00);
  closeParen = ParserBase::expect(&this_00->super_ParserBase,CloseParenthesis);
  bVar1 = ParserBase::peek(&this_00->super_ParserBase,IntersectKeyword);
  if (bVar1) {
    intersect = ParserBase::consume(&this_00->super_ParserBase);
    ranges = parseRangeList(this_00);
    intersects = slang::syntax::SyntaxFactory::intersectClause(&this_00->factory,intersect,ranges);
  }
  else {
    intersects = (IntersectClauseSyntax *)0x0;
  }
  pBVar2 = slang::syntax::SyntaxFactory::binsSelectConditionExpr
                     (&this_00->factory,binsof,openParen,name,closeParen,intersects);
  return pBVar2;
}

Assistant:

BinsSelectExpressionSyntax& Parser::parseBinsSelectPrimary() {
    auto parseCondition = [&]() -> BinsSelectConditionExprSyntax& {
        auto binsof = expect(TokenKind::BinsOfKeyword);
        auto openParen = expect(TokenKind::OpenParenthesis);
        auto& name = parseName();
        auto closeParen = expect(TokenKind::CloseParenthesis);

        IntersectClauseSyntax* intersectClause = nullptr;
        if (peek(TokenKind::IntersectKeyword)) {
            auto intersect = consume();
            auto& ranges = parseRangeList();
            intersectClause = &factory.intersectClause(intersect, ranges);
        }

        return factory.binsSelectConditionExpr(binsof, openParen, name, closeParen,
                                               intersectClause);
    };

    auto parseMatches = [&] {
        MatchesClauseSyntax* matchesClause = nullptr;
        if (peek(TokenKind::MatchesKeyword)) {
            auto matches = consume();
            auto& matchExpr = parseSubExpression(ExpressionOptions::BinsSelectContext, 0);
            matchesClause = &factory.matchesClause(matches, factory.expressionPattern(matchExpr));
        }
        return matchesClause;
    };

    BinsSelectExpressionSyntax* result;
    switch (peek().kind) {
        case TokenKind::BinsOfKeyword:
            result = &parseCondition();
            break;
        case TokenKind::Exclamation: {
            auto op = consume();
            result = &factory.unaryBinsSelectExpr(op, parseCondition());
            break;
        }
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& expr = parseBinsSelectExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            result = &factory.parenthesizedBinsSelectExpr(openParen, expr, closeParen);
            break;
        }
        default: {
            auto& expr = parseSubExpression(ExpressionOptions::BinsSelectContext, 0);
            auto matches = parseMatches();
            result = &factory.simpleBinsSelectExpr(expr, matches);
            break;
        }
    }

    if (peek(TokenKind::WithKeyword)) {
        auto with = consume();
        auto openParen = expect(TokenKind::OpenParenthesis);
        auto& expr = parseExpression();
        auto closeParen = expect(TokenKind::CloseParenthesis);
        auto matches = parseMatches();
        result = &factory.binSelectWithFilterExpr(*result, with, openParen, expr, closeParen,
                                                  matches);
    }

    return *result;
}